

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O2

void Aig_ObjClearRepr(Aig_Man_t *p,Aig_Obj_t *pNode)

{
  if (p->pReprs == (Aig_Obj_t **)0x0) {
    __assert_fail("p->pReprs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                  ,0x99,"void Aig_ObjClearRepr(Aig_Man_t *, Aig_Obj_t *)");
  }
  if (((ulong)pNode & 1) == 0) {
    if (pNode->Id < p->nReprsAlloc) {
      p->pReprs[pNode->Id] = (Aig_Obj_t *)0x0;
      return;
    }
    __assert_fail("pNode->Id < p->nReprsAlloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                  ,0x9b,"void Aig_ObjClearRepr(Aig_Man_t *, Aig_Obj_t *)");
  }
  __assert_fail("!Aig_IsComplement(pNode)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                ,0x9a,"void Aig_ObjClearRepr(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

static inline void Aig_ObjClearRepr( Aig_Man_t * p, Aig_Obj_t * pNode )
{
    assert( p->pReprs != NULL );
    assert( !Aig_IsComplement(pNode) );
    assert( pNode->Id < p->nReprsAlloc );
    p->pReprs[pNode->Id] = NULL;
}